

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void substSelect(SubstContext *pSubst,Select *p,int doPrior)

{
  Expr *pEVar1;
  int in_EDX;
  SubstContext *in_RSI;
  int i;
  SrcItem *pItem;
  SrcList *pSrc;
  undefined4 in_stack_00000020;
  ExprList *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint uVar2;
  int iVar3;
  int *local_28;
  int *piVar4;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar3 = -0x55555556;
  if (in_RSI != (SubstContext *)0x0) {
    do {
      substExprList((SubstContext *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
      substExprList((SubstContext *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
      substExprList((SubstContext *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
      pEVar1 = substExpr((SubstContext *)p,(Expr *)CONCAT44(doPrior,in_stack_00000020));
      in_RSI[1].pEList = (ExprList *)pEVar1;
      pEVar1 = substExpr((SubstContext *)p,(Expr *)CONCAT44(doPrior,in_stack_00000020));
      *(Expr **)&in_RSI[1].iTable = pEVar1;
      piVar4 = (int *)in_RSI[1].pParse;
      local_28 = piVar4 + 2;
      for (iVar3 = *piVar4; 0 < iVar3; iVar3 = iVar3 + -1) {
        if ((*(ushort *)((long)local_28 + 0x19) >> 2 & 1) != 0) {
          substSelect(in_RSI,(Select *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                      (int)((ulong)piVar4 >> 0x20));
        }
        if ((*(ushort *)((long)local_28 + 0x19) >> 3 & 1) != 0) {
          substExprList((SubstContext *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
        }
        local_28 = local_28 + 0x12;
      }
      uVar2 = in_stack_ffffffffffffffd0 & 0xffffff;
      if (in_EDX != 0) {
        in_RSI = (SubstContext *)in_RSI[2].pParse;
        uVar2 = CONCAT13(in_RSI != (SubstContext *)0x0,(int3)in_stack_ffffffffffffffd0);
      }
      in_stack_ffffffffffffffd0 = uVar2;
    } while ((char)(uVar2 >> 0x18) != '\0');
  }
  return;
}

Assistant:

static void substSelect(
  SubstContext *pSubst, /* Description of the substitution */
  Select *p,            /* SELECT statement in which to make substitutions */
  int doPrior           /* Do substitutes on p->pPrior too */
){
  SrcList *pSrc;
  SrcItem *pItem;
  int i;
  if( !p ) return;
  do{
    substExprList(pSubst, p->pEList);
    substExprList(pSubst, p->pGroupBy);
    substExprList(pSubst, p->pOrderBy);
    p->pHaving = substExpr(pSubst, p->pHaving);
    p->pWhere = substExpr(pSubst, p->pWhere);
    pSrc = p->pSrc;
    assert( pSrc!=0 );
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      if( pItem->fg.isSubquery ){
        substSelect(pSubst, pItem->u4.pSubq->pSelect, 1);
      }
      if( pItem->fg.isTabFunc ){
        substExprList(pSubst, pItem->u1.pFuncArg);
      }
    }
  }while( doPrior && (p = p->pPrior)!=0 );
}